

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

char * __thiscall
Memory::LargeHeapBlock::Alloc(LargeHeapBlock *this,size_t size,ObjectInfoBits attributes)

{
  uint uVar1;
  undefined4 *puVar2;
  LargeObjectHeader *header;
  Recycler *this_00;
  HeapInfo *pHVar3;
  code *pcVar4;
  bool bVar5;
  byte bVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 *in_FS_OFFSET;
  
  if ((size == 0 || (size & 0xf) != 0) &&
     ((this->pageHeapData == (PageHeapData *)0x0 ||
      (this->pageHeapData->pageHeapMode == PageHeapModeOff)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x259,"(HeapInfo::IsAlignedSize(size) || InPageHeapMode())",
                       "HeapInfo::IsAlignedSize(size) || InPageHeapMode()");
    if (!bVar5) goto LAB_00267562;
    *puVar2 = 0;
  }
  if (InternalObjectInfoBitMask < attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x25a,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar5) goto LAB_00267562;
    *puVar2 = 0;
  }
  if ((attributes & TrackBit) != NoBit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x25e,"((attributes & TrackBit) == 0)",
                       "Large tracked object collection not implemented");
    if (!bVar5) goto LAB_00267562;
    *puVar2 = 0;
  }
  header = (LargeObjectHeader *)this->allocAddressEnd;
  bVar5 = IsPartialSweptHeader(this,header);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x263,"(!IsPartialSweptHeader(header))","!IsPartialSweptHeader(header)");
    if (!bVar5) goto LAB_00267562;
    *puVar2 = 0;
  }
  pcVar8 = this->allocAddressEnd + size + 0x20;
  pcVar7 = this->allocAddressEnd + 0x20;
  if (pcVar8 < pcVar7 || this->addressEnd < pcVar8) {
    return (char *)0x0;
  }
  this_00 = this->heapInfo->recycler;
  if ((this_00->recyclerFlagsTable->Verbose == true) &&
     ((bVar5 = Js::Phases::IsEnabled(&this_00->recyclerFlagsTable->Trace,MemoryAllocationPhase),
      bVar5 || (bVar5 = Js::Phases::IsEnabled
                                  (&this_00->recyclerFlagsTable->Trace,LargeMemoryAllocationPhase),
               bVar5)))) {
    Output::Print(L"Allocated object of size 0x%x in existing heap block at address 0x%p\n",size,
                  pcVar7);
  }
  if (this->objectCount <= this->allocCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x271,"(allocCount < objectCount)","allocCount < objectCount");
    if (!bVar5) {
LAB_00267562:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  this->allocAddressEnd = pcVar8;
  Recycler::VerifyZeroFill(this_00,header,0x20);
  if (this_00->verifyEnabled == false) {
    bVar6 = header->field_0x1a & 0xfd;
  }
  else {
    header->next = (LargeObjectHeader *)0x0;
    header->attributesAndChecksum = 0;
    *(undefined2 *)&header->field_0x1a = 0;
    header->unused4 = 0;
    header->objectIndex = 0;
    header->unused1 = 0;
    header->objectSize = 0;
    bVar6 = 0;
  }
  header->objectIndex = this->allocCount;
  header->objectSize = size;
  header->field_0x1a = (byte)(attributes >> 7) & 2 | bVar6;
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    *(undefined ***)pcVar7 = &PTR_Finalize_00378068;
  }
  LargeObjectHeader::SetAttributes(header,this_00->Cookie,(uchar)attributes);
  uVar1 = this->allocCount;
  this->allocCount = uVar1 + 1;
  (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar1] = (_func_int **)header;
  this->finalizeCount = this->finalizeCount + ((attributes & 0x80) >> 7);
  if ((attributes & FinalizeBit) != NoBit) {
    pHVar3 = this->heapInfo;
    pHVar3->liveFinalizableObjectCount = pHVar3->liveFinalizableObjectCount + 1;
    pHVar3->newFinalizableObjectCount = pHVar3->newFinalizableObjectCount + 1;
  }
  return pcVar7;
}

Assistant:

char*
LargeHeapBlock::Alloc(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes)
{
    Assert(HeapInfo::IsAlignedSize(size) || InPageHeapMode());
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
#ifdef RECYCLER_VISITED_HOST
    AssertMsg((attributes & TrackBit) == 0 || (attributes & RecyclerVisitedHostBit), "Large tracked object implemented just for recycler visited objects");
#else
    AssertMsg((attributes & TrackBit) == 0, "Large tracked object collection not implemented");
#endif

    LargeObjectHeader * header = (LargeObjectHeader *)allocAddressEnd;
#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
    Assert(!IsPartialSweptHeader(header));
#endif
    char * allocObject = allocAddressEnd + sizeof(LargeObjectHeader);       // shouldn't overflow
    char * newAllocAddressEnd = allocObject + size;
    if (newAllocAddressEnd > addressEnd || newAllocAddressEnd < allocObject)
    {
        return nullptr;
    }

    Recycler* recycler = this->heapInfo->recycler;
#if DBG
    LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Allocated object of size 0x%x in existing heap block at address 0x%p\n"), size, allocObject);
#endif

    Assert(allocCount < objectCount);
    allocAddressEnd = newAllocAddressEnd;
#ifdef RECYCLER_ZERO_MEM_CHECK
    recycler->VerifyZeroFill(header, sizeof(LargeObjectHeader));
#endif
#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        memset(header, 0, sizeof(LargeObjectHeader));
    }
#endif

    header->objectIndex = allocCount;
    header->objectSize = size;
#ifdef RECYCLER_WRITE_BARRIER
    header->hasWriteBarrier = (attributes&WithBarrierBit) == WithBarrierBit;
#endif
    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
        allocObject = (char *)new (allocObject) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
        // On ARM, make sure the v-table write is performed before setting the attributes
        MemoryBarrier();
#endif
    }
    header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));
    HeaderList()[allocCount++] = header;
    finalizeCount += ((attributes & FinalizeBit) != 0);

#ifdef RECYCLER_FINALIZE_CHECK
    if (attributes & FinalizeBit)
    {
        HeapInfo * heapInfo = this->heapInfo;
        heapInfo->liveFinalizableObjectCount++;
        heapInfo->newFinalizableObjectCount++;
    }
#endif

    return allocObject;
}